

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O1

bool __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Unite(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  byte bVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_rep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u_rep;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c0;
  bool local_a0;
  key_type local_98;
  key_type local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )&local_c0,this,u);
  bVar8 = local_a0;
  bVar7 = 1;
  if (local_a0 == true) {
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_58,this,v);
    bVar7 = local_38 ^ 1;
  }
  if ((bVar8 != false) && (local_38 == true)) {
    local_38 = false;
    if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10)) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  lVar1 = (long)&local_c0._M_value + 0x10;
  if (local_a0 == true) {
    local_a0 = false;
    if (local_c0._M_value._M_dataplus._M_p != (_Alloc_hider)lVar1) {
      operator_delete((void *)local_c0._M_value._M_dataplus._M_p,
                      CONCAT71(local_c0._17_7_,local_c0._16_1_) + 1);
    }
  }
  if (bVar7 == 0) {
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_c0,this,u);
    if (local_c0._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
      local_78.field_2._8_8_ = local_c0._24_8_;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78._M_dataplus._M_p = (pointer)local_c0._M_value._M_dataplus._M_p;
    }
    local_78.field_2._M_allocated_capacity._1_7_ = local_c0._17_7_;
    local_78.field_2._M_local_buf[0] = local_c0._16_1_;
    local_78._M_string_length = local_c0._M_value._M_string_length;
    local_c0._M_value._M_string_length = 0;
    local_c0._16_1_ = 0;
    if (local_a0 == true) {
      local_a0 = false;
    }
    local_c0._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_c0,this,v);
    uVar2 = local_c0._M_value._M_string_length;
    if (local_c0._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
      local_98.field_2._8_8_ = local_c0._24_8_;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98._M_dataplus._M_p = (pointer)local_c0._M_value._M_dataplus._M_p;
    }
    local_98.field_2._M_allocated_capacity._1_7_ = local_c0._17_7_;
    local_98.field_2._M_local_buf[0] = local_c0._16_1_;
    local_98._M_string_length = local_c0._M_value._M_string_length;
    local_c0._M_value._M_string_length = 0;
    local_c0._16_1_ = 0;
    if (local_a0 == true) {
      local_a0 = false;
    }
    if (local_78._M_string_length == uVar2) {
      if (local_78._M_string_length == 0) {
        bVar8 = true;
        local_c0._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
      }
      else {
        local_c0._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
        iVar3 = bcmp(local_78._M_dataplus._M_p,local_98._M_dataplus._M_p,local_78._M_string_length);
        bVar8 = iVar3 == 0;
      }
    }
    else {
      bVar8 = false;
      local_c0._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
    }
    if (bVar8 == false) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->size_)._M_h,&local_78);
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->size_)._M_h,&local_98);
      if (*(ulong *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28) <
          *(ulong *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  (&local_78,&local_98);
      }
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,&local_98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28),&local_78);
      *(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      ._M_cur + 0x28) =
           *(long *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28) +
           *(long *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar8 = (bool)(bVar8 ^ 1);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool Unite(const Type& u, const Type& v) {
    if (!Find(u) || !Find(v))
      return false;
    Type u_rep = *Find(u);
    Type v_rep = *Find(v);
    if (!TypeEqual(u_rep, v_rep)) {
      auto u_rep_size_it = size_.find(u_rep);
      auto v_rep_size_it = size_.find(v_rep);
      if (u_rep_size_it->second < v_rep_size_it->second)
        std::swap(u_rep, v_rep);
      parent_.find(v_rep)->second = u_rep;
      u_rep_size_it->second += v_rep_size_it->second;
      return true;
    }
    return false;
  }